

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpConnection.cpp
# Opt level: O3

ssize_t __thiscall
Liby::UdpConnection::send(UdpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  _Head_base<0UL,_std::function<void_()>_*,_false> __ptr;
  __uniq_ptr_data<std::function<void_()>,_std::default_delete<std::function<void_()>_>,_true,_true>
  this_00;
  UdpSocket *pUVar1;
  UdpSocket *extraout_RAX;
  UdpSocket *extraout_RAX_00;
  undefined4 in_register_00000034;
  bool bVar2;
  undefined1 local_61;
  undefined1 local_60 [24];
  _Head_base<0UL,_std::function<void_()>_*,_false> local_48;
  char *local_40;
  Buffer *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  size_t local_20;
  
  local_40 = (char *)CONCAT44(in_register_00000034,__fd);
  if (this->socket_ != (UdpSocket *)0x0) {
    local_60._8_8_ = (element_type *)0x0;
    local_60._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_48._M_head_impl = (function<void_()> *)0x0;
    local_20 = strlen(local_40);
    local_38 = (Buffer *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<Liby::Buffer,std::allocator<Liby::Buffer>,char_const*&,unsigned_long>
              (a_Stack_30,&local_38,(allocator<Liby::Buffer> *)&local_61,&local_40,&local_20);
    local_60._8_8_ = local_38;
    local_60._16_8_ = a_Stack_30[0]._M_pi;
    local_60._0_8_ = &this->peer_;
    if (*(long *)((long)__buf + 0x10) != 0) {
      this_00.
      super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>.
      _M_t.
      super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
      .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl =
           (__uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>)
           operator_new(0x20);
      std::function<void_()>::function
                ((function<void_()> *)
                 this_00.
                 super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
                 .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl,
                 (function<void_()> *)__buf);
      __ptr._M_head_impl = local_48._M_head_impl;
      bVar2 = local_48._M_head_impl != (function<void_()> *)0x0;
      local_48._M_head_impl =
           (function<void_()> *)
           this_00.
           super___uniq_ptr_impl<std::function<void_()>,_std::default_delete<std::function<void_()>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::function<void_()>_*,_std::default_delete<std::function<void_()>_>_>
           .super__Head_base<0UL,_std::function<void_()>_*,_false>._M_head_impl;
      if (bVar2) {
        std::default_delete<std::function<void_()>_>::operator()
                  ((default_delete<std::function<void_()>_> *)&local_48,__ptr._M_head_impl);
      }
    }
    pUVar1 = this->socket_;
    std::deque<Liby::udp_io_task,_std::allocator<Liby::udp_io_task>_>::
    emplace_back<Liby::udp_io_task>(&pUVar1->writTasks_,(udp_io_task *)local_60);
    pUVar1 = UdpSocket::enableWrit(pUVar1,true);
    if (local_48._M_head_impl != (function<void_()> *)0x0) {
      std::default_delete<std::function<void_()>_>::operator()
                ((default_delete<std::function<void_()>_> *)&local_48,local_48._M_head_impl);
      pUVar1 = extraout_RAX;
    }
    local_48._M_head_impl = (function<void_()> *)0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._16_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_60._16_8_);
      pUVar1 = extraout_RAX_00;
    }
    return (ssize_t)pUVar1;
  }
  __assert_fail("socket_",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/UdpConnection.cpp"
                ,0x2a,"void Liby::UdpConnection::send(const char *, const BasicHandler &)");
}

Assistant:

void UdpConnection::send(const char *buf, const BasicHandler &handler) {
    assert(socket_);
    udp_io_task utask;
    utask.buffer_ = std::make_shared<Buffer>(buf, ::strlen(buf));
    utask.dest_ = &peer_;
    if (handler) {
        utask.handler_ = std::make_unique<BasicHandler>(handler);
    }
    socket_->send(std::move(utask));
}